

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O2

FString M_ZLibError(int zerr)

{
  uint in_ESI;
  char *copyStr;
  undefined4 in_register_0000003c;
  FString *this;
  
  this = (FString *)CONCAT44(in_register_0000003c,zerr);
  if ((int)in_ESI < 0) {
    if (in_ESI < 0xfffffffa) {
      this->Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FString::Format(this,"%d");
      return (FString)(char *)this;
    }
    copyStr = _ZZ11M_ZLibErroriE4errs_rel +
              *(int *)(_ZZ11M_ZLibErroriE4errs_rel + (ulong)~in_ESI * 4);
  }
  else {
    copyStr = "OK";
  }
  FString::FString(this,copyStr);
  return (FString)(char *)this;
}

Assistant:

FString M_ZLibError(int zerr)
{
	if (zerr >= 0)
	{
		return "OK";
	}
	else if (zerr < -6)
	{
		FString out;
		out.Format("%d", zerr);
		return out;
	}
	else
	{
		static const char *errs[6] =
		{
			"Errno",
			"Stream Error",
			"Data Error",
			"Memory Error",
			"Buffer Error",
			"Version Error"
		};
		return errs[-zerr - 1];
	}
}